

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::verifyTextureBindings(TextureCubeMapArrayGetterCalls *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  float fVar5;
  float fVar6;
  GLboolean bool_value;
  GLfloat float_value;
  GLint int_value;
  char local_1a1;
  float local_1a0 [2];
  undefined1 local_198 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1a0[0] = 0.0;
  local_1a1 = '\0';
  local_1a0[1] = 0.0;
  (**(code **)(lVar4 + 0x798))(0x900a,&local_1a1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetBooleanv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1ab);
  if ((this->m_to_id == 0 && local_1a1 != '\0') || (local_1a1 != '\x01' && this->m_to_id != 0)) {
    local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetBooleanv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this->m_test_passed = '\0';
  }
  (**(code **)(lVar4 + 0x818))(0x900a,local_1a0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetFloatv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1b8);
  fVar6 = local_1a0[0] - (float)this->m_to_id;
  fVar5 = -fVar6;
  if (-fVar6 <= fVar6) {
    fVar5 = fVar6;
  }
  if (1e-05 < fVar5) {
    local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetFloatv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this->m_test_passed = '\0';
  }
  (**(code **)(lVar4 + 0x868))(0x900a,local_1a0 + 1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1c4);
  fVar6 = local_1a0[0] - (float)this->m_to_id;
  fVar5 = -fVar6;
  if (-fVar6 <= fVar6) {
    fVar5 = fVar6;
  }
  if (1e-05 < fVar5) {
    local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetIntegerv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this->m_test_passed = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArrayGetterCalls::verifyTextureBindings(void)
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	glw::GLboolean		  bool_value  = GL_FALSE;
	const float			  epsilon	 = 1e-5f;
	glw::GLfloat		  float_value = 0.0f;
	glw::GLint			  int_value   = 0;

	/* Check glGetBooleanv() reports a correct value */
	gl.getBooleanv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if ((m_to_id == 0 && bool_value != GL_FALSE) || (m_to_id != 0 && bool_value != GL_TRUE))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glGetBooleanv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
			<< tcu::TestLog::EndMessage;
		m_test_passed = false;
	}

	/* Check glGetFloatv() reports a correct value */
	gl.getFloatv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if (de::abs(float_value - static_cast<float>(m_to_id)) > epsilon)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetFloatv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
						   << tcu::TestLog::EndMessage;
		m_test_passed = false;
	}

	/* Check glGetIntegerv() reports a correct value */
	gl.getIntegerv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if (de::abs(float_value - static_cast<float>(m_to_id)) > epsilon)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glGetIntegerv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
			<< tcu::TestLog::EndMessage;
		m_test_passed = false;
	}
}